

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# database.cpp
# Opt level: O2

void __thiscall
duckdb::DatabaseInstance::Configure(DatabaseInstance *this,DBConfig *new_config,char *database_path)

{
  DBConfig *this_00;
  DBConfigOptions *this_01;
  unique_ptr<duckdb::Allocator,_std::default_delete<duckdb::Allocator>,_true> *this_02;
  unique_ptr<duckdb::ErrorManager,_std::default_delete<duckdb::ErrorManager>,_true> *this_03;
  _Head_base<0UL,_duckdb::FileSystem_*,_false> _Var1;
  undefined8 uVar2;
  type fs;
  idx_t iVar3;
  shared_ptr<duckdb::Allocator,_true> *other;
  allocator local_89;
  Value local_88;
  string local_48;
  
  this_00 = &this->config;
  this_01 = &(this->config).options;
  DBConfigOptions::operator=(this_01,&new_config->options);
  if ((this->config).options.duckdb_api._M_string_length == 0) {
    ::std::__cxx11::string::string((string *)&local_48,"duckdb_api",&local_89);
    Value::Value(&local_88,"cpp");
    DBConfig::SetOptionByName(this_00,&local_48,&local_88);
    Value::~Value(&local_88);
    ::std::__cxx11::string::~string((string *)&local_48);
  }
  if (database_path == (char *)0x0) {
    (this->config).options.database_path._M_string_length = 0;
    *(this->config).options.database_path._M_dataplus._M_p = '\0';
  }
  else {
    ::std::__cxx11::string::assign((char *)this_01);
  }
  if ((new_config->options).temporary_directory._M_string_length == 0) {
    DBConfig::SetDefaultTempDirectory(this_00);
  }
  if ((this->config).options.access_mode == UNDEFINED) {
    (this->config).options.access_mode = READ_WRITE;
  }
  ::std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::ExtensionOption>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::ExtensionOption>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::operator=(&(this->config).extension_parameters._M_h,&(new_config->extension_parameters)._M_h);
  if ((new_config->file_system).
      super_unique_ptr<duckdb::FileSystem,_std::default_delete<duckdb::FileSystem>_>._M_t.
      super___uniq_ptr_impl<duckdb::FileSystem,_std::default_delete<duckdb::FileSystem>_>._M_t.
      super__Tuple_impl<0UL,_duckdb::FileSystem_*,_std::default_delete<duckdb::FileSystem>_>.
      super__Head_base<0UL,_duckdb::FileSystem_*,_false>._M_head_impl == (FileSystem *)0x0) {
    make_uniq<duckdb::VirtualFileSystem>();
    uVar2 = local_88.type_._0_8_;
    local_88.type_._0_8_ = (pointer)0x0;
    _Var1._M_head_impl =
         (this->config).file_system.
         super_unique_ptr<duckdb::FileSystem,_std::default_delete<duckdb::FileSystem>_>._M_t.
         super___uniq_ptr_impl<duckdb::FileSystem,_std::default_delete<duckdb::FileSystem>_>._M_t.
         super__Tuple_impl<0UL,_duckdb::FileSystem_*,_std::default_delete<duckdb::FileSystem>_>.
         super__Head_base<0UL,_duckdb::FileSystem_*,_false>._M_head_impl;
    (this->config).file_system.
    super_unique_ptr<duckdb::FileSystem,_std::default_delete<duckdb::FileSystem>_>._M_t.
    super___uniq_ptr_impl<duckdb::FileSystem,_std::default_delete<duckdb::FileSystem>_>._M_t.
    super__Tuple_impl<0UL,_duckdb::FileSystem_*,_std::default_delete<duckdb::FileSystem>_>.
    super__Head_base<0UL,_duckdb::FileSystem_*,_false>._M_head_impl = (FileSystem *)uVar2;
    if (_Var1._M_head_impl != (FileSystem *)0x0) {
      (*(_Var1._M_head_impl)->_vptr_FileSystem[1])();
      if ((pointer)local_88.type_._0_8_ != (pointer)0x0) {
        (*(*(_func_int ***)local_88.type_._0_8_)[1])();
      }
    }
  }
  else {
    std::__uniq_ptr_impl<duckdb::FileSystem,_std::default_delete<duckdb::FileSystem>_>::operator=
              ((__uniq_ptr_impl<duckdb::FileSystem,_std::default_delete<duckdb::FileSystem>_> *)
               &(this->config).file_system,
               (__uniq_ptr_impl<duckdb::FileSystem,_std::default_delete<duckdb::FileSystem>_> *)
               &new_config->file_system);
  }
  if ((database_path != (char *)0x0) && ((this->config).options.enable_external_access == false)) {
    ::std::__cxx11::string::string((string *)&local_88,database_path,(allocator *)&local_48);
    DBConfig::AddAllowedPath(this_00,(string *)&local_88);
    ::std::__cxx11::string::~string((string *)&local_88);
    ::std::__cxx11::string::string((string *)&local_48,".wal",&local_89);
    ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_88,
                     database_path,&local_48);
    DBConfig::AddAllowedPath(this_00,(string *)&local_88);
    ::std::__cxx11::string::~string((string *)&local_88);
    ::std::__cxx11::string::~string((string *)&local_48);
    if ((this->config).options.temporary_directory._M_string_length != 0) {
      DBConfig::AddAllowedDirectory(this_00,&(this->config).options.temporary_directory);
    }
  }
  if ((new_config->secret_manager).
      super_unique_ptr<duckdb::SecretManager,_std::default_delete<duckdb::SecretManager>_>._M_t.
      super___uniq_ptr_impl<duckdb::SecretManager,_std::default_delete<duckdb::SecretManager>_>._M_t
      .super__Tuple_impl<0UL,_duckdb::SecretManager_*,_std::default_delete<duckdb::SecretManager>_>.
      super__Head_base<0UL,_duckdb::SecretManager_*,_false>._M_head_impl != (SecretManager *)0x0) {
    ::std::__uniq_ptr_impl<duckdb::SecretManager,_std::default_delete<duckdb::SecretManager>_>::
    operator=((__uniq_ptr_impl<duckdb::SecretManager,_std::default_delete<duckdb::SecretManager>_> *
              )&(this->config).secret_manager,
              (__uniq_ptr_impl<duckdb::SecretManager,_std::default_delete<duckdb::SecretManager>_> *
              )&new_config->secret_manager);
  }
  if ((this->config).options.maximum_memory == 0xffffffffffffffff) {
    DBConfig::SetDefaultMaxMemory(this_00);
  }
  if ((new_config->options).maximum_threads == 0xffffffffffffffff) {
    fs = unique_ptr<duckdb::FileSystem,_std::default_delete<duckdb::FileSystem>,_true>::operator*
                   (&(this->config).file_system);
    iVar3 = DBConfig::GetSystemMaxThreads(fs);
    (this->config).options.maximum_threads = iVar3;
  }
  this_02 = &(this->config).allocator;
  ::std::__uniq_ptr_impl<duckdb::Allocator,_std::default_delete<duckdb::Allocator>_>::operator=
            ((__uniq_ptr_impl<duckdb::Allocator,_std::default_delete<duckdb::Allocator>_> *)this_02,
             (__uniq_ptr_impl<duckdb::Allocator,_std::default_delete<duckdb::Allocator>_> *)
             &new_config->allocator);
  if ((this->config).allocator.
      super_unique_ptr<duckdb::Allocator,_std::default_delete<duckdb::Allocator>_>._M_t.
      super___uniq_ptr_impl<duckdb::Allocator,_std::default_delete<duckdb::Allocator>_>._M_t.
      super__Tuple_impl<0UL,_duckdb::Allocator_*,_std::default_delete<duckdb::Allocator>_>.
      super__Head_base<0UL,_duckdb::Allocator_*,_false>._M_head_impl == (Allocator *)0x0) {
    make_uniq<duckdb::Allocator>();
    uVar2 = local_88.type_._0_8_;
    local_88.type_._0_8_ = (pointer)0x0;
    ::std::__uniq_ptr_impl<duckdb::Allocator,_std::default_delete<duckdb::Allocator>_>::reset
              ((__uniq_ptr_impl<duckdb::Allocator,_std::default_delete<duckdb::Allocator>_> *)
               this_02,(pointer)uVar2);
    ::std::unique_ptr<duckdb::Allocator,_std::default_delete<duckdb::Allocator>_>::~unique_ptr
              ((unique_ptr<duckdb::Allocator,_std::default_delete<duckdb::Allocator>_> *)&local_88);
  }
  ::std::vector<duckdb::ReplacementScan,_std::allocator<duckdb::ReplacementScan>_>::_M_move_assign
            (&(this->config).replacement_scans.
              super_vector<duckdb::ReplacementScan,_std::allocator<duckdb::ReplacementScan>_>,
             &new_config->replacement_scans);
  ::std::vector<duckdb::ParserExtension,_std::allocator<duckdb::ParserExtension>_>::_M_move_assign
            (&(this->config).parser_extensions.
              super_vector<duckdb::ParserExtension,_std::allocator<duckdb::ParserExtension>_>,
             &new_config->parser_extensions);
  this_03 = &(this->config).error_manager;
  ::std::__uniq_ptr_impl<duckdb::ErrorManager,_std::default_delete<duckdb::ErrorManager>_>::
  operator=((__uniq_ptr_impl<duckdb::ErrorManager,_std::default_delete<duckdb::ErrorManager>_> *)
            this_03,(__uniq_ptr_impl<duckdb::ErrorManager,_std::default_delete<duckdb::ErrorManager>_>
                     *)&new_config->error_manager);
  if ((this->config).error_manager.
      super_unique_ptr<duckdb::ErrorManager,_std::default_delete<duckdb::ErrorManager>_>._M_t.
      super___uniq_ptr_impl<duckdb::ErrorManager,_std::default_delete<duckdb::ErrorManager>_>._M_t.
      super__Tuple_impl<0UL,_duckdb::ErrorManager_*,_std::default_delete<duckdb::ErrorManager>_>.
      super__Head_base<0UL,_duckdb::ErrorManager_*,_false>._M_head_impl == (ErrorManager *)0x0) {
    make_uniq<duckdb::ErrorManager>();
    uVar2 = local_88.type_._0_8_;
    local_88.type_._0_8_ = (pointer)0x0;
    ::std::__uniq_ptr_impl<duckdb::ErrorManager,_std::default_delete<duckdb::ErrorManager>_>::reset
              ((__uniq_ptr_impl<duckdb::ErrorManager,_std::default_delete<duckdb::ErrorManager>_> *)
               this_03,(pointer)uVar2);
    ::std::unique_ptr<duckdb::ErrorManager,_std::default_delete<duckdb::ErrorManager>_>::~unique_ptr
              ((unique_ptr<duckdb::ErrorManager,_std::default_delete<duckdb::ErrorManager>_> *)
               &local_88);
  }
  if ((this->config).default_allocator.internal.
      super___shared_ptr<duckdb::Allocator,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
      (element_type *)0x0) {
    other = Allocator::DefaultAllocatorReference();
    shared_ptr<duckdb::Allocator,_true>::operator=(&(this->config).default_allocator,other);
  }
  if ((new_config->buffer_pool).internal.
      super___shared_ptr<duckdb::BufferPool,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
      (element_type *)0x0) {
    make_shared_ptr<duckdb::BufferPool,unsigned_long&,bool&,unsigned_long&>
              ((unsigned_long *)&local_88,(bool *)&(this->config).options.maximum_memory,
               (unsigned_long *)&(this->config).options.buffer_manager_track_eviction_timestamps);
    shared_ptr<duckdb::BufferPool,_true>::operator=
              (&(this->config).buffer_pool,(shared_ptr<duckdb::BufferPool,_true> *)&local_88);
    ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_88.type_.type_info_);
  }
  else {
    shared_ptr<duckdb::BufferPool,_true>::operator=
              (&(this->config).buffer_pool,&new_config->buffer_pool);
  }
  shared_ptr<duckdb::DatabaseCacheEntry,_true>::operator=
            (&(this->config).db_cache_entry,&new_config->db_cache_entry);
  return;
}

Assistant:

void DatabaseInstance::Configure(DBConfig &new_config, const char *database_path) {
	config.options = new_config.options;

	if (config.options.duckdb_api.empty()) {
		config.SetOptionByName("duckdb_api", "cpp");
	}

	if (database_path) {
		config.options.database_path = database_path;
	} else {
		config.options.database_path.clear();
	}

	if (new_config.options.temporary_directory.empty()) {
		config.SetDefaultTempDirectory();
	}

	if (config.options.access_mode == AccessMode::UNDEFINED) {
		config.options.access_mode = AccessMode::READ_WRITE;
	}
	config.extension_parameters = new_config.extension_parameters;
	if (new_config.file_system) {
		config.file_system = std::move(new_config.file_system);
	} else {
		config.file_system = make_uniq<VirtualFileSystem>();
	}
	if (database_path && !config.options.enable_external_access) {
		config.AddAllowedPath(database_path);
		config.AddAllowedPath(database_path + string(".wal"));
		if (!config.options.temporary_directory.empty()) {
			config.AddAllowedDirectory(config.options.temporary_directory);
		}
	}
	if (new_config.secret_manager) {
		config.secret_manager = std::move(new_config.secret_manager);
	}
	if (config.options.maximum_memory == DConstants::INVALID_INDEX) {
		config.SetDefaultMaxMemory();
	}
	if (new_config.options.maximum_threads == DConstants::INVALID_INDEX) {
		config.options.maximum_threads = config.GetSystemMaxThreads(*config.file_system);
	}
	config.allocator = std::move(new_config.allocator);
	if (!config.allocator) {
		config.allocator = make_uniq<Allocator>();
	}
	config.replacement_scans = std::move(new_config.replacement_scans);
	config.parser_extensions = std::move(new_config.parser_extensions);
	config.error_manager = std::move(new_config.error_manager);
	if (!config.error_manager) {
		config.error_manager = make_uniq<ErrorManager>();
	}
	if (!config.default_allocator) {
		config.default_allocator = Allocator::DefaultAllocatorReference();
	}
	if (new_config.buffer_pool) {
		config.buffer_pool = std::move(new_config.buffer_pool);
	} else {
		config.buffer_pool = make_shared_ptr<BufferPool>(config.options.maximum_memory,
		                                                 config.options.buffer_manager_track_eviction_timestamps,
		                                                 config.options.allocator_bulk_deallocation_flush_threshold);
	}
	config.db_cache_entry = std::move(new_config.db_cache_entry);
}